

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

bool vkt::pipeline::anon_unknown_0::validateResultImage<tcu::Texture1DView>
               (Texture1DView *texture,Sampler *sampler,VkComponentMapping *swz,
               ConstPixelBufferAccess *texCoords,Vec2 *lodBounds,LookupPrecision *lookupPrecision,
               Vec4 *lookupScale,Vec4 *lookupBias,ConstPixelBufferAccess *result,
               PixelBufferAccess *errorMask)

{
  PtrData<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> data;
  undefined8 lookupPrecision_00;
  bool bVar1;
  Texture1D *texture_00;
  Texture1D *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  Vec4 local_9c;
  Vec4 local_8c;
  PtrData<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> local_70;
  PtrData<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *local_60;
  undefined1 local_50 [8];
  UniquePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> swizzledTex;
  LookupPrecision *lookupPrecision_local;
  Vec2 *lodBounds_local;
  ConstPixelBufferAccess *texCoords_local;
  VkComponentMapping *swz_local;
  Sampler *sampler_local;
  Texture1DView *texture_local;
  
  swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data._8_8_ =
       lookupPrecision;
  bVar1 = isIdentitySwizzle(swz);
  if (bVar1) {
    texture_local._7_1_ =
         validateResultImage<tcu::Texture1DView>
                   (texture,sampler,texCoords,lodBounds,
                    (LookupPrecision *)
                    swizzledTex.
                    super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.
                    _8_8_,lookupScale,lookupBias,result,errorMask);
  }
  else {
    createSwizzledCopy<tcu::Texture1DView>
              ((MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)&local_70,texture,swz
              );
    local_60 = de::details::MovePtr::operator_cast_to_PtrData(&local_70,(MovePtr *)texture);
    data._8_8_ = in_stack_ffffffffffffff10;
    data.ptr = in_stack_ffffffffffffff08;
    de::details::UniquePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::UniquePtr
              ((UniquePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)local_50,data);
    de::details::MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::~MovePtr
              ((MovePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)&local_70);
    texture_00 = de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::
                 operator*((UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)
                           local_50);
    lookupPrecision_00 =
         swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.
         _8_8_;
    swizzleScaleBias((anon_unknown_0 *)&local_8c,lookupScale,swz);
    swizzleScaleBias((anon_unknown_0 *)&local_9c,lookupBias,swz);
    texture_local._7_1_ =
         validateResultImage<tcu::Texture1D>
                   (texture_00,sampler,texCoords,lodBounds,(LookupPrecision *)lookupPrecision_00,
                    &local_8c,&local_9c,result,errorMask);
    de::details::UniquePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::~UniquePtr
              ((UniquePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)local_50);
  }
  return texture_local._7_1_;
}

Assistant:

bool validateResultImage (const TextureViewType&				texture,
						  const tcu::Sampler&					sampler,
						  const vk::VkComponentMapping&			swz,
						  const tcu::ConstPixelBufferAccess&	texCoords,
						  const tcu::Vec2&						lodBounds,
						  const tcu::LookupPrecision&			lookupPrecision,
						  const tcu::Vec4&						lookupScale,
						  const tcu::Vec4&						lookupBias,
						  const tcu::ConstPixelBufferAccess&	result,
						  const tcu::PixelBufferAccess&			errorMask)
{
	if (isIdentitySwizzle(swz))
		return validateResultImage(texture, sampler, texCoords, lodBounds, lookupPrecision, lookupScale, lookupBias, result, errorMask);
	else
	{
		// There is (currently) no way to handle swizzling inside validation loop
		// and thus we need to pre-swizzle the texture.
		UniquePtr<typename TexViewTraits<TextureViewType>::TextureType>	swizzledTex	(createSwizzledCopy(texture, swz));

		return validateResultImage(*swizzledTex, sampler, texCoords, lodBounds, lookupPrecision, swizzleScaleBias(lookupScale, swz), swizzleScaleBias(lookupBias, swz), result, errorMask);
	}
}